

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

string * __thiscall
OpenSSLWrapper::SslConnection::GetSslErrAsString_abi_cxx11_
          (string *__return_storage_ptr__,SslConnection *this)

{
  ulong uVar1;
  char *pcVar2;
  size_t len;
  allocator<char> local_51;
  string local_50 [8];
  string buf;
  uint local_20;
  uint32_t nError;
  SslConnection *this_local;
  string *strTmp;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar1 = ERR_get_error();
  local_20 = (uint)uVar1;
  while (local_20 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,0x200,'\0',&local_51);
    std::allocator<char>::~allocator(&local_51);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
    len = std::__cxx11::string::size();
    ERR_error_string_n((ulong)local_20,pcVar2,len);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\n");
    uVar1 = ERR_get_error();
    std::__cxx11::string::~string(local_50);
    local_20 = (uint)uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

string SslConnection::GetSslErrAsString()
    {
        /*BIO *bio = BIO_new(BIO_s_mem());
        ERR_print_errors(bio);
        char *buf = NULL;
        size_t len = BIO_get_mem_data(bio, &buf);
        string strTmp(buf, len);
        BIO_free(bio);*/

        string strTmp;
        uint32_t nError = ERR_get_error();
        while (nError != 0)
        {
            string buf(512, 0);
            ERR_error_string_n(nError, &buf[0], buf.size());
            strTmp += &buf[0];
            strTmp += "\r\n";
            nError = ERR_get_error();
        }
        return strTmp;
    }